

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O0

void cjson_create_array_reference_should_create_an_array_reference(void)

{
  cJSON_bool cVar1;
  cJSON *item;
  cJSON *item_00;
  cJSON *item_01;
  cJSON *number;
  cJSON *number_array;
  cJSON *number_reference;
  
  item = cJSON_CreateArray();
  item_00 = cJSON_CreateNumber(42.0);
  cVar1 = cJSON_IsNumber(item_00);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x209);
  }
  cVar1 = cJSON_IsArray(item);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x20a);
  }
  cJSON_AddItemToArray(item,item_00);
  item_01 = cJSON_CreateArrayReference(item_00);
  if (item_01->child != item_00) {
    UnityFail(" Expected TRUE Was FALSE",0x20e);
  }
  UnityAssertEqualNumber(0x120,(long)item_01->type,(char *)0x0,0x20f,UNITY_DISPLAY_STYLE_INT);
  cJSON_Delete(item);
  cJSON_Delete(item_01);
  return;
}

Assistant:

static void cjson_create_array_reference_should_create_an_array_reference(void) {
    cJSON *number_reference = NULL;
    cJSON *number_array = cJSON_CreateArray();
    cJSON *number = cJSON_CreateNumber(42);

    TEST_ASSERT_TRUE(cJSON_IsNumber(number));
    TEST_ASSERT_TRUE(cJSON_IsArray(number_array));
    cJSON_AddItemToArray(number_array, number);

    number_reference = cJSON_CreateArrayReference(number);
    TEST_ASSERT_TRUE(number_reference->child == number);
    TEST_ASSERT_EQUAL_INT(cJSON_Array | cJSON_IsReference, number_reference->type);

    cJSON_Delete(number_array);
    cJSON_Delete(number_reference);
}